

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O2

bool __thiscall common::Config::GetHost(Config *this,string *group,int index,Host *host)

{
  pointer psVar1;
  __type _Var2;
  ulong uVar3;
  int iVar4;
  size_t i;
  ulong uVar5;
  long lVar6;
  
  lVar6 = 0;
  iVar4 = 0;
  uVar5 = 0;
  do {
    psVar1 = (this->m_hosts).
             super__Vector_base<std::shared_ptr<common::Host>,_std::allocator<std::shared_ptr<common::Host>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar3 = (long)(this->m_hosts).
                  super__Vector_base<std::shared_ptr<common::Host>,_std::allocator<std::shared_ptr<common::Host>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4;
    if (uVar3 <= uVar5) {
LAB_0010eb1e:
      return uVar5 < uVar3;
    }
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (*(long *)((long)&(psVar1->
                                              super___shared_ptr<common::Host,_(__gnu_cxx::_Lock_policy)2>
                                              )._M_ptr + lVar6) + 0xa0),group);
    if (_Var2) {
      if (iVar4 == index) {
        Host::operator=(host,*(Host **)((long)&(((this->m_hosts).
                                                 super__Vector_base<std::shared_ptr<common::Host>,_std::allocator<std::shared_ptr<common::Host>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->
                                               super___shared_ptr<common::Host,_(__gnu_cxx::_Lock_policy)2>
                                               )._M_ptr + lVar6));
        goto LAB_0010eb1e;
      }
      iVar4 = iVar4 + 1;
    }
    uVar5 = uVar5 + 1;
    lVar6 = lVar6 + 0x10;
  } while( true );
}

Assistant:

bool Config::GetHost(const std::string& group, int index, Host* host) {
    int num = 0;
    for (size_t i = 0; i < m_hosts.size(); i++) {
        if (m_hosts[i]->group == group) {
            if (num == index) {
                *host = *m_hosts[i];
                return true;
            }
            num++;
        }
    }
    return false;
}